

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::circle(Fl_Graphics_Driver *this,double x,double y,double r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  code *local_88;
  double local_80;
  double local_70;
  int h;
  int lly;
  int w;
  int llx;
  double ry;
  double rx;
  double yt;
  double xt;
  double r_local;
  double y_local;
  double x_local;
  Fl_Graphics_Driver *this_local;
  
  dVar1 = transform_x(this,x,y);
  dVar2 = transform_y(this,x,y);
  dVar3 = (this->m).c;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    local_70 = sqrt((this->m).a * (this->m).a + (this->m).c * (this->m).c);
  }
  else {
    local_70 = ABS((this->m).a);
  }
  dVar3 = (this->m).b;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    local_80 = sqrt((this->m).b * (this->m).b + (this->m).d * (this->m).d);
  }
  else {
    local_80 = ABS((this->m).d);
  }
  dVar3 = rint(dVar1 - r * local_70);
  dVar1 = rint(dVar1 + r * local_70);
  dVar4 = rint(dVar2 - r * local_80);
  dVar2 = rint(dVar2 + r * local_80);
  if (this->what == 2) {
    local_88 = XFillArc;
  }
  else {
    local_88 = XDrawArc;
  }
  (*local_88)(fl_display,fl_window,fl_gc,(int)dVar3,(int)dVar4,(int)dVar1 - (int)dVar3,
              (int)dVar2 - (int)dVar4,0,0x5a00);
  return;
}

Assistant:

void Fl_Graphics_Driver::circle(double x, double y,double r) {
  double xt = transform_x(x,y);
  double yt = transform_y(x,y);
  double rx = r * (m.c ? sqrt(m.a*m.a+m.c*m.c) : fabs(m.a));
  double ry = r * (m.b ? sqrt(m.b*m.b+m.d*m.d) : fabs(m.d));
  int llx = (int)rint(xt-rx);
  int w = (int)rint(xt+rx)-llx;
  int lly = (int)rint(yt-ry);
  int h = (int)rint(yt+ry)-lly;

#if defined(USE_X11)
  (what == POLYGON ? XFillArc : XDrawArc)
    (fl_display, fl_window, fl_gc, llx, lly, w, h, 0, 360*64);
#elif defined(WIN32)
  if (what==POLYGON) {
    SelectObject(fl_gc, fl_brush());
    Pie(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
  } else
    Arc(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
#elif defined(__APPLE_QUARTZ__)
  // Quartz warning: circle won't scale to current matrix!
  // Last argument must be 0 (counter-clockwise) or it draws nothing under __LP64__ !!!!
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextAddArc(fl_gc, xt, yt, (w+h)*0.25f, 0, 2.0f*M_PI, 0);
  (what == POLYGON ? CGContextFillPath : CGContextStrokePath)(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}